

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

bool __thiscall units::measurement::operator==(measurement *this,measurement *other)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  dVar5 = value_as(other,&this->units_);
  dVar1 = this->value_;
  bVar2 = true;
  if ((dVar1 != dVar5) || (NAN(dVar1) || NAN(dVar5))) {
    fVar4 = (float)dVar1;
    fVar6 = (float)dVar5;
    fVar7 = fVar4 - fVar6;
    if (((fVar7 != 0.0) || (NAN(fVar7))) &&
       ((NAN(fVar7) || ((uint)ABS(fVar7) < 0x7f800001 && ((uint)fVar7 & 0x7f800000) != 0)))) {
      fVar7 = (float)((int)fVar4 + 8U & 0xfffffff0);
      fVar8 = (float)((int)fVar6 + 8U & 0xfffffff0);
      if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
        fVar3 = (float)((int)(fVar6 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar7 != fVar3) || (NAN(fVar7) || NAN(fVar3))) {
          fVar6 = (float)((int)(fVar6 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar7 != fVar6) || (NAN(fVar7) || NAN(fVar6))) {
            fVar6 = (float)((int)(fVar4 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar8 != fVar6) || (NAN(fVar8) || NAN(fVar6))) {
              bVar2 = (bool)(-(fVar8 == (float)((int)(fVar4 * 0.9999995) + 8U & 0xfffffff0)) & 1);
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ == val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }